

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O3

bool __thiscall rapic::client::dequeue(client *this,message_type *type)

{
  size_t *pos;
  __int_type _Var1;
  string *psVar2;
  bool bVar3;
  runtime_error *this_00;
  message_type mVar4;
  
  if (this->cur_type_ != ~mssg) {
    LOCK();
    (this->rcount_).super___atomic_base<unsigned_long>._M_i =
         (this->rcount_).super___atomic_base<unsigned_long>._M_i + this->cur_size_;
    UNLOCK();
  }
  this->cur_type_ = ~mssg;
  this->cur_size_ = 0;
  if ((this->wcount_).super___atomic_base<unsigned_long>._M_i !=
      (this->rcount_).super___atomic_base<unsigned_long>._M_i) {
    pos = &this->cur_size_;
    do {
      if (0x20 < (this->buffer_)._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl
                 [(this->rcount_).super___atomic_base<unsigned_long>._M_i % this->capacity_]) {
        _Var1 = (this->wcount_).super___atomic_base<unsigned_long>._M_i;
        bVar3 = buffer_starts_with(this,&msg_mssg_head_abi_cxx11_);
        if (bVar3) {
          bVar3 = buffer_starts_with(this,&msg_mssg30_head_abi_cxx11_);
          if (bVar3) {
            bVar3 = buffer_find(this,&msg_mssg30_term_abi_cxx11_,pos);
            if (!bVar3) {
LAB_001080e4:
              if (_Var1 - (this->rcount_).super___atomic_base<unsigned_long>._M_i != this->capacity_
                 ) {
                return false;
              }
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (this_00,"rapic: buffer overflow (try increasing buffer size)");
              __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            psVar2 = &msg_mssg30_term_abi_cxx11_;
          }
          else {
            bVar3 = buffer_find(this,&msg_mssg_term_abi_cxx11_,pos);
            if (!bVar3) goto LAB_001080e4;
            psVar2 = &msg_mssg_term_abi_cxx11_;
          }
          mVar4 = mssg;
        }
        else {
          bVar3 = buffer_find(this,&msg_scan_term_abi_cxx11_,pos);
          if (!bVar3) goto LAB_001080e4;
          psVar2 = &msg_scan_term_abi_cxx11_;
          mVar4 = scan;
        }
        *type = mVar4;
        this->cur_type_ = mVar4;
        this->cur_size_ = this->cur_size_ + psVar2->_M_string_length;
        return true;
      }
      LOCK();
      (this->rcount_).super___atomic_base<unsigned_long>._M_i =
           (this->rcount_).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
    } while ((this->wcount_).super___atomic_base<unsigned_long>._M_i !=
             (this->rcount_).super___atomic_base<unsigned_long>._M_i);
  }
  return false;
}

Assistant:

auto client::dequeue(message_type& type) -> bool
{
  // move along to the next packet in the buffer if needed
  if (cur_type_ != no_message)
    rcount_ += cur_size_;

  // reset our current type
  cur_type_ = no_message;
  cur_size_ = 0;

  // ignore leading whitespace (and return if no data at all)
  while (true)
  {
    if (wcount_ == rcount_)
      return false;
    if (buffer_[rcount_ % capacity_] > 0x20)
      break;
    ++rcount_;
  }

  // cache write count to ensure consistent overflow check at the end of this function
  auto wc = wcount_.load();

  // is it an MSSG style message?
  if (buffer_starts_with(msg_mssg_head))
  {
    // status 30 is multi-line terminated by "END STATUS"
    if (buffer_starts_with(msg_mssg30_head))
    {
      if (buffer_find(msg_mssg30_term, cur_size_))
      {
        cur_type_ = type = message_type::mssg;
        cur_size_ += msg_mssg30_term.size();
        return true;
      }
    }
    // otherwise assume it is a single line message and look for an end of line
    else
    {
      if (buffer_find(msg_mssg_term, cur_size_))
      {
        cur_type_ = type = message_type::mssg;
        cur_size_ += msg_mssg_term.size();
        return true;
      }
    }
  }
  // otherwise assume it is a scan message and look for "END RADAR IMAGE"
  else
  {
    if (buffer_find(msg_scan_term, cur_size_))
    {
      cur_type_ = type = message_type::scan;
      cur_size_ += msg_scan_term.size();
      return true;
    }
  }

  // if the buffer is full but we still cannot read a message then we are in overflow, fail hard
  if (wc - rcount_ == capacity_)
    throw std::runtime_error{"rapic: buffer overflow (try increasing buffer size)"};

  return false;
}